

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int memdbOpen(sqlite3_vfs *pVfs,char *zName,sqlite3_file *pFd,int flags,int *pOutFlags)

{
  int iVar1;
  int iVar2;
  sqlite3_mutex *psVar3;
  MemStore **ppMVar4;
  uint in_ECX;
  long lVar5;
  undefined8 *in_RDX;
  char *in_RSI;
  uint *in_R8;
  MemStore **apNew;
  sqlite3_mutex *pVfsMutex;
  int i;
  int szName;
  MemStore *p;
  MemFile *pFile;
  char *in_stack_ffffffffffffffa8;
  u64 in_stack_ffffffffffffffb0;
  int local_48;
  MemStore *__s;
  undefined8 *pOld;
  
  __s = (MemStore *)0x0;
  pOld = in_RDX;
  memset(in_RDX,0,0x18);
  iVar1 = sqlite3Strlen30(in_stack_ffffffffffffffa8);
  if ((iVar1 < 2) || ((*in_RSI != '/' && (*in_RSI != '\\')))) {
    __s = (MemStore *)sqlite3Malloc(in_stack_ffffffffffffffb0);
    if (__s == (MemStore *)0x0) {
      return 7;
    }
    memset(__s,0,0x48);
    __s->mFlags = 3;
    __s->szMax = sqlite3Config.mxMemdbSize;
  }
  else {
    psVar3 = sqlite3MutexAlloc((int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    sqlite3_mutex_enter((sqlite3_mutex *)0x15ac04);
    for (local_48 = 0; local_48 < memdb_g.nMemStore; local_48 = local_48 + 1) {
      iVar2 = strcmp(memdb_g.apMemStore[local_48]->zFName,in_RSI);
      if (iVar2 == 0) {
        __s = memdb_g.apMemStore[local_48];
        break;
      }
    }
    if (__s == (MemStore *)0x0) {
      __s = (MemStore *)sqlite3Malloc((u64)psVar3);
      if (__s == (MemStore *)0x0) {
        sqlite3_mutex_leave((sqlite3_mutex *)0x15aca4);
        return 7;
      }
      ppMVar4 = (MemStore **)sqlite3Realloc(pOld,(u64)__s);
      if (ppMVar4 == (MemStore **)0x0) {
        sqlite3_free((void *)0x15ace2);
        sqlite3_mutex_leave((sqlite3_mutex *)0x15acec);
        return 7;
      }
      lVar5 = (long)memdb_g.nMemStore;
      memdb_g.nMemStore = memdb_g.nMemStore + 1;
      ppMVar4[lVar5] = __s;
      memdb_g.apMemStore = ppMVar4;
      memset(__s,0,0x48);
      iVar2 = (int)((ulong)ppMVar4 >> 0x20);
      __s->mFlags = 3;
      __s->szMax = sqlite3Config.mxMemdbSize;
      __s->zFName = (char *)(__s + 1);
      memcpy(__s->zFName,in_RSI,(long)(iVar1 + 1));
      psVar3 = sqlite3_mutex_alloc(iVar2);
      __s->pMutex = psVar3;
      if (__s->pMutex == (sqlite3_mutex *)0x0) {
        memdb_g.nMemStore = memdb_g.nMemStore + -1;
        sqlite3_free((void *)0x15adb9);
        sqlite3_mutex_leave((sqlite3_mutex *)0x15adc3);
        return 7;
      }
      __s->nRef = 1;
      memdbEnter((MemStore *)0x15ade6);
    }
    else {
      memdbEnter((MemStore *)0x15adf2);
      __s->nRef = __s->nRef + 1;
    }
    sqlite3_mutex_leave((sqlite3_mutex *)0x15ae0a);
  }
  pOld[1] = __s;
  if (in_R8 != (uint *)0x0) {
    *in_R8 = in_ECX | 0x80;
  }
  *in_RDX = &memdb_io_methods;
  memdbLeave((MemStore *)0x15ae9a);
  return 0;
}

Assistant:

static int memdbOpen(
  sqlite3_vfs *pVfs,
  const char *zName,
  sqlite3_file *pFd,
  int flags,
  int *pOutFlags
){
  MemFile *pFile = (MemFile*)pFd;
  MemStore *p = 0;
  int szName;
  UNUSED_PARAMETER(pVfs);

  memset(pFile, 0, sizeof(*pFile));
  szName = sqlite3Strlen30(zName);
  if( szName>1 && (zName[0]=='/' || zName[0]=='\\') ){
    int i;
#ifndef SQLITE_MUTEX_OMIT
    sqlite3_mutex *pVfsMutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_VFS1);
#endif
    sqlite3_mutex_enter(pVfsMutex);
    for(i=0; i<memdb_g.nMemStore; i++){
      if( strcmp(memdb_g.apMemStore[i]->zFName,zName)==0 ){
        p = memdb_g.apMemStore[i];
        break;
      }
    }
    if( p==0 ){
      MemStore **apNew;
      p = sqlite3Malloc( sizeof(*p) + szName + 3 );
      if( p==0 ){
        sqlite3_mutex_leave(pVfsMutex);
        return SQLITE_NOMEM;
      }
      apNew = sqlite3Realloc(memdb_g.apMemStore,
                             sizeof(apNew[0])*(memdb_g.nMemStore+1) );
      if( apNew==0 ){
        sqlite3_free(p);
        sqlite3_mutex_leave(pVfsMutex);
        return SQLITE_NOMEM;
      }
      apNew[memdb_g.nMemStore++] = p;
      memdb_g.apMemStore = apNew;
      memset(p, 0, sizeof(*p));
      p->mFlags = SQLITE_DESERIALIZE_RESIZEABLE|SQLITE_DESERIALIZE_FREEONCLOSE;
      p->szMax = sqlite3GlobalConfig.mxMemdbSize;
      p->zFName = (char*)&p[1];
      memcpy(p->zFName, zName, szName+1);
      p->pMutex = sqlite3_mutex_alloc(SQLITE_MUTEX_FAST);
      if( p->pMutex==0 ){
        memdb_g.nMemStore--;
        sqlite3_free(p);
        sqlite3_mutex_leave(pVfsMutex);
        return SQLITE_NOMEM;
      }
      p->nRef = 1;
      memdbEnter(p);
    }else{
      memdbEnter(p);
      p->nRef++;
    }
    sqlite3_mutex_leave(pVfsMutex);
  }else{
    p = sqlite3Malloc( sizeof(*p) );
    if( p==0 ){
      return SQLITE_NOMEM;
    }
    memset(p, 0, sizeof(*p));
    p->mFlags = SQLITE_DESERIALIZE_RESIZEABLE | SQLITE_DESERIALIZE_FREEONCLOSE;
    p->szMax = sqlite3GlobalConfig.mxMemdbSize;
  }
  pFile->pStore = p;
  if( pOutFlags!=0 ){
    *pOutFlags = flags | SQLITE_OPEN_MEMORY;
  }
  pFd->pMethods = &memdb_io_methods;
  memdbLeave(p);
  return SQLITE_OK;
}